

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substring.cpp
# Opt level: O3

string_t __thiscall
duckdb::SubstringGrapheme(duckdb *this,Vector *result,string_t input,int64_t offset,int64_t length)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  long offset_00;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  char *input_data;
  ulong input_size;
  anon_union_16_2_67f50693_for_value aVar9;
  GraphemeIterator GVar10;
  GraphemeCluster GVar11;
  anon_struct_16_3_d7536bce_for_pointer aVar12;
  GraphemeClusterIterator __end1;
  GraphemeClusterIterator __begin1;
  ulong local_88;
  GraphemeClusterIterator local_80;
  GraphemeClusterIterator local_60;
  undefined8 local_40;
  char *local_38;
  
  offset_00 = input.value._8_8_;
  local_38 = input.value._0_8_;
  input_data = local_38;
  if ((uint)result < 0xd) {
    input_data = (char *)((long)&local_40 + 4);
  }
  input_size = (ulong)result & 0xffffffff;
  local_40 = result;
  AssertInSupportedRange(input_size,offset_00,offset);
  if (offset == 0) goto LAB_014c72a9;
  if (offset_00 < 1) {
    if (offset_00 < 0) {
      uVar7 = 0;
      if (0 < (long)(input_size + offset_00)) {
        uVar7 = input_size + offset_00;
      }
      goto LAB_014c7269;
    }
    if (offset < 2) goto LAB_014c72a9;
    lVar6 = offset + -1;
    local_88 = 0;
LAB_014c7271:
    uVar7 = lVar6 + local_88;
    if (input_size < lVar6 + local_88) {
      uVar7 = input_size;
    }
  }
  else {
    uVar7 = offset_00 - 1U;
    if (input_size < offset_00 - 1U) {
      uVar7 = input_size;
    }
LAB_014c7269:
    lVar6 = offset;
    local_88 = uVar7;
    if (0 < offset) goto LAB_014c7271;
    local_88 = 0;
    if (0 < (long)(uVar7 + offset)) {
      local_88 = uVar7 + offset;
    }
  }
  lVar6 = uVar7 - local_88;
  if (lVar6 == 0) {
LAB_014c72a9:
    aVar9.pointer = (anon_struct_16_3_d7536bce_for_pointer)SubstringEmptyString((Vector *)this);
    return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar9.pointer;
  }
  uVar3 = uVar7 + 1;
  if (input_size <= uVar7 + 1) {
    uVar3 = input_size;
  }
  if ((uint)result != 0) {
    uVar8 = 0;
    do {
      if (input_data[uVar8] < '\0') {
        uVar3 = local_88;
        if (offset_00 < 0) {
          sVar4 = Utf8Proc::GraphemeCount(input_data,input_size);
          uVar7 = 0;
          if (0 < (long)(offset_00 + sVar4)) {
            uVar7 = offset_00 + sVar4;
          }
          uVar8 = uVar7 + offset;
          if (offset < 1) {
            uVar3 = 0;
            if (0 < (long)uVar8) {
              uVar3 = uVar8;
            }
          }
          else {
            uVar3 = uVar7;
            uVar7 = uVar8;
            if ((long)sVar4 < (long)uVar8) {
              uVar7 = sVar4;
            }
          }
        }
        GVar10 = Utf8Proc::GraphemeClusters(input_data,input_size);
        GraphemeIterator::GraphemeClusterIterator::GraphemeClusterIterator
                  (&local_60,GVar10.s,GVar10.len);
        GraphemeIterator::GraphemeClusterIterator::GraphemeClusterIterator(&local_80,(char *)0x0,0);
        bVar2 = GraphemeIterator::GraphemeClusterIterator::operator!=(&local_60,&local_80);
        if (!bVar2) goto LAB_014c73e8;
        local_88 = 0xffffffffffffffff;
        uVar8 = 0;
        goto LAB_014c7392;
      }
      uVar8 = uVar8 + 1;
    } while (uVar3 != uVar8);
  }
LAB_014c72ea:
  aVar9.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       SubstringSlice((Vector *)this,input_data,local_88,lVar6);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar9.pointer;
  while( true ) {
    local_88 = uVar1;
    uVar8 = uVar8 + 1;
    GraphemeIterator::GraphemeClusterIterator::operator++(&local_60);
    bVar2 = GraphemeIterator::GraphemeClusterIterator::operator!=(&local_60,&local_80);
    uVar5 = input_size;
    if (!bVar2) break;
LAB_014c7392:
    GVar11 = GraphemeIterator::GraphemeClusterIterator::operator*(&local_60);
    uVar1 = GVar11.start;
    if ((uVar3 != uVar8) && (uVar5 = GVar11.start, uVar1 = local_88, uVar7 == uVar8)) break;
  }
  if (local_88 == 0xffffffffffffffff) {
LAB_014c73e8:
    aVar12 = (anon_struct_16_3_d7536bce_for_pointer)SubstringEmptyString((Vector *)this);
    return (string_t)aVar12;
  }
  lVar6 = uVar5 - local_88;
  goto LAB_014c72ea;
}

Assistant:

string_t SubstringGrapheme(Vector &result, string_t input, int64_t offset, int64_t length) {
	auto input_data = input.GetData();
	auto input_size = input.GetSize();

	AssertInSupportedRange(input_size, offset, length);

	// we don't know yet if the substring is ascii, but we assume it is (for now)
	// first get the start and end as if this was an ascii string
	int64_t start, end;
	if (!SubstringStartEnd(UnsafeNumericCast<int64_t>(input_size), offset, length, start, end)) {
		return SubstringEmptyString(result);
	}

	// now check if all the characters between 0 and end are ascii characters
	// note that we scan one further to check for a potential combining diacritics (e.g. i + diacritic is ï)
	bool is_ascii = true;
	idx_t ascii_end = MinValue<idx_t>(UnsafeNumericCast<idx_t>(end + 1), input_size);
	for (idx_t i = 0; i < ascii_end; i++) {
		if (input_data[i] & 0x80) {
			// found a non-ascii character: eek
			is_ascii = false;
			break;
		}
	}
	if (is_ascii) {
		// all characters are ascii, we can just slice the substring
		return SubstringSlice(result, input_data, start, end - start);
	}
	// if the characters are not ascii, we need to scan grapheme clusters
	// first figure out which direction we need to scan
	// offset = 0 case is taken care of in SubstringStartEnd
	if (offset < 0) {
		// negative offset, this case is more difficult
		// we first need to count the number of characters in the string
		idx_t num_characters = Utf8Proc::GraphemeCount(input_data, input_size);
		// now call substring start and end again, but with the number of unicode characters this time
		SubstringStartEnd(UnsafeNumericCast<int64_t>(num_characters), offset, length, start, end);
	}

	// now scan the graphemes of the string to find the positions of the start and end characters
	int64_t current_character = 0;
	idx_t start_pos = DConstants::INVALID_INDEX, end_pos = input_size;
	for (auto cluster : Utf8Proc::GraphemeClusters(input_data, input_size)) {
		if (current_character == start) {
			start_pos = cluster.start;
		} else if (current_character == end) {
			end_pos = cluster.start;
			break;
		}
		current_character++;
	}
	if (start_pos == DConstants::INVALID_INDEX) {
		return SubstringEmptyString(result);
	}
	// after we have found these, we can slice the substring
	return SubstringSlice(result, input_data, UnsafeNumericCast<int64_t>(start_pos),
	                      UnsafeNumericCast<int64_t>(end_pos - start_pos));
}